

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O2

bool charmap_HasChar(char *input)

{
  Charmap *pCVar1;
  
  pCVar1 = *currentCharmap + 1;
  while( true ) {
    if ((long)*input == 0) {
      return (bool)*(undefined1 *)&pCVar1->name;
    }
    if ((&pCVar1->name)[*input] == (char *)0x0) break;
    pCVar1 = (Charmap *)((long)(&pCVar1->name)[*input] * 0x800 + (long)(*currentCharmap + 1));
    input = input + 1;
  }
  return false;
}

Assistant:

bool charmap_HasChar(char const *input)
{
	struct Charmap const *charmap = *currentCharmap;
	struct Charnode const *node = &charmap->nodes[0];

	for (; *input; input++) {
		size_t next = node->next[*input - 1];

		if (!next)
			return false;
		node = &charmap->nodes[next];
	}

	return node->isTerminal;
}